

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O1

void __thiscall
btSimulationIslandManager::storeIslandActivationState
          (btSimulationIslandManager *this,btCollisionWorld *colWorld)

{
  btElement *pbVar1;
  btCollisionObject **ppbVar2;
  btElement *pbVar3;
  btCollisionObject *pbVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  btElement *pbVar10;
  
  lVar5 = (long)(colWorld->m_collisionObjects).m_size;
  if (0 < lVar5) {
    ppbVar2 = (colWorld->m_collisionObjects).m_data;
    pbVar3 = (this->m_unionFind).m_elements.m_data;
    lVar7 = 0;
    iVar8 = 0;
    do {
      pbVar4 = ppbVar2[lVar7];
      if ((pbVar4->m_collisionFlags & 3) == 0) {
        pbVar1 = pbVar3 + iVar8;
        iVar9 = pbVar1->m_id;
        pbVar10 = pbVar1;
        iVar6 = iVar8;
        if (iVar9 != iVar8) {
          do {
            pbVar10->m_id = pbVar3[iVar9].m_id;
            iVar6 = pbVar3[iVar9].m_id;
            iVar9 = pbVar3[iVar6].m_id;
            pbVar10 = pbVar3 + iVar6;
          } while (iVar6 != iVar9);
        }
        pbVar4->m_islandTag1 = iVar6;
        pbVar1->m_sz = (int)lVar7;
        pbVar4->m_companionId = -1;
        iVar8 = iVar8 + 1;
      }
      else {
        pbVar4->m_islandTag1 = -1;
        pbVar4->m_companionId = -2;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar5);
  }
  return;
}

Assistant:

void   btSimulationIslandManager::storeIslandActivationState(btCollisionWorld* colWorld)
{
	// put the islandId ('find' value) into m_tag   
	{
		int index = 0;
		int i;
		for (i=0;i<colWorld->getCollisionObjectArray().size();i++)
		{
			btCollisionObject* collisionObject= colWorld->getCollisionObjectArray()[i];
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag( m_unionFind.find(index) );
				//Set the correct object offset in Collision Object Array
				m_unionFind.getElement(index).m_sz = i;
				collisionObject->setCompanionId(-1);
				index++;
			} else
			{
				collisionObject->setIslandTag(-1);
				collisionObject->setCompanionId(-2);
			}
		}
	}
}